

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

int notRecursiveHugeTest(char *filename,char *result,char *err,int options)

{
  long lVar1;
  int local_40;
  uint local_3c;
  int ret;
  int res;
  xmlTextReaderPtr reader;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  nb_tests = nb_tests + 1;
  lVar1 = xmlReaderForFile("huge:test",0,6);
  if (lVar1 == 0) {
    fprintf(_stderr,"Failed to open huge:test\n");
    filename_local._4_4_ = 1;
  }
  else {
    local_40 = xmlTextReaderRead(lVar1);
    while (local_40 == 1) {
      local_40 = xmlTextReaderRead(lVar1);
    }
    if (local_40 != 0) {
      fprintf(_stderr,"Failed to parser huge:test with entities\n");
    }
    local_3c = (uint)(local_40 != 0);
    xmlFreeTextReader(lVar1);
    filename_local._4_4_ = local_3c;
  }
  return filename_local._4_4_;
}

Assistant:

static int
notRecursiveHugeTest(const char *filename ATTRIBUTE_UNUSED,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options ATTRIBUTE_UNUSED) {
    xmlTextReaderPtr reader;
    int res = 0;
    int ret;

    nb_tests++;

    reader = xmlReaderForFile("huge:test" , NULL,
                              XML_PARSE_NOENT | XML_PARSE_DTDLOAD);
    if (reader == NULL) {
        fprintf(stderr, "Failed to open huge:test\n");
	return(1);
    }
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
        ret = xmlTextReaderRead(reader);
    }
    if (ret != 0) {
        fprintf(stderr, "Failed to parser huge:test with entities\n");
	res = 1;
    }
    xmlFreeTextReader(reader);

    return(res);
}